

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_randomness(int N,void *pBuf)

{
  uchar uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  sqlite3_mutex *psVar8;
  sqlite3_vfs *psVar9;
  long lVar10;
  long in_FS_OFFSET;
  char k [256];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = sqlite3_initialize();
  if (iVar7 == 0) {
    bVar3 = true;
    if (sqlite3Config.bCoreMutex == '\0') {
LAB_00116137:
      psVar8 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(5);
      if (psVar8 == (sqlite3_mutex *)0x0) goto LAB_00116137;
      (*sqlite3Config.mutex.xMutexEnter)(psVar8);
      bVar3 = false;
    }
    if (N < 1 || pBuf == (void *)0x0) {
      sqlite3Prng.isInit = '\0';
      if (!bVar3) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar8);
          return;
        }
        goto LAB_001162b9;
      }
    }
    else {
      if (sqlite3Prng.isInit == '\0') {
        psVar9 = sqlite3_vfs_find((char *)0x0);
        uVar4 = sqlite3Config.iPrngSeed;
        sqlite3Prng.i = '\0';
        sqlite3Prng.j = '\0';
        if (psVar9 == (sqlite3_vfs *)0x0) {
          memset(k,0,0x100);
        }
        else if (sqlite3Config.iPrngSeed == 0) {
          (*psVar9->xRandomness)(psVar9,0x100,k);
        }
        else {
          memset(k,0,0x100);
          uVar5 = sqlite3Config.iPrngSeed;
          sqlite3Config.iPrngSeed._0_1_ = (undefined1)uVar4;
          sqlite3Config.iPrngSeed._1_1_ = SUB41(uVar4,1);
          sqlite3Config.iPrngSeed._2_1_ = SUB41(uVar4,2);
          sqlite3Config.iPrngSeed._3_1_ = SUB41(uVar4,3);
          k[0] = (undefined1)sqlite3Config.iPrngSeed;
          k[1] = sqlite3Config.iPrngSeed._1_1_;
          k[2] = sqlite3Config.iPrngSeed._2_1_;
          k[3] = sqlite3Config.iPrngSeed._3_1_;
          sqlite3Config.iPrngSeed = uVar5;
        }
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          sqlite3Prng.s[lVar10] = (uchar)lVar10;
        }
        bVar6 = sqlite3Prng.j;
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          bVar6 = bVar6 + k[lVar10] + sqlite3Prng.s[lVar10];
          uVar1 = sqlite3Prng.s[bVar6];
          sqlite3Prng.s[bVar6] = sqlite3Prng.s[lVar10];
          sqlite3Prng.s[lVar10] = uVar1;
        }
        sqlite3Prng.isInit = '\x01';
      }
      else {
        bVar6 = sqlite3Prng.j;
      }
      lVar10 = 0;
      do {
        sqlite3Prng.i = sqlite3Prng.i + 1;
        uVar1 = sqlite3Prng.s[sqlite3Prng.i];
        bVar6 = bVar6 + uVar1;
        sqlite3Prng.s[sqlite3Prng.i] = sqlite3Prng.s[bVar6];
        sqlite3Prng.s[bVar6] = uVar1;
        *(uchar *)((long)pBuf + lVar10) =
             sqlite3Prng.s[(byte)(uVar1 + sqlite3Prng.s[sqlite3Prng.i])];
        lVar10 = lVar10 + 1;
      } while (N != (int)lVar10);
      sqlite3Prng.j = bVar6;
      if (!bVar3) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_001162b9:
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char t;
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.isInit = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.  The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  **
  ** Nothing in this file or anywhere else in SQLite does any kind of
  ** encryption.  The RC4 algorithm is being used as a PRNG (pseudo-random
  ** number generator) not as an encryption device.
  */
  if( !wsdPrng.isInit ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    int i;
    char k[256];
    wsdPrng.j = 0;
    wsdPrng.i = 0;
    if( NEVER(pVfs==0) ){
      memset(k, 0, sizeof(k));
    }else{
      sqlite3OsRandomness(pVfs, 256, k);
    }
    for(i=0; i<256; i++){
      wsdPrng.s[i] = (u8)i;
    }
    for(i=0; i<256; i++){
      wsdPrng.j += wsdPrng.s[i] + k[i];
      t = wsdPrng.s[wsdPrng.j];
      wsdPrng.s[wsdPrng.j] = wsdPrng.s[i];
      wsdPrng.s[i] = t;
    }
    wsdPrng.isInit = 1;
  }

  assert( N>0 );
  do{
    wsdPrng.i++;
    t = wsdPrng.s[wsdPrng.i];
    wsdPrng.j += t;
    wsdPrng.s[wsdPrng.i] = wsdPrng.s[wsdPrng.j];
    wsdPrng.s[wsdPrng.j] = t;
    t += wsdPrng.s[wsdPrng.i];
    *(zBuf++) = wsdPrng.s[t];
  }while( --N );
  sqlite3_mutex_leave(mutex);
}